

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

void __thiscall QPDFJob::Config::encrypt(Config *this,char *__block,int __edflag)

{
  element_type *peVar1;
  EncConfig *this_00;
  string *in_RCX;
  string *in_R8;
  string *owner_password_local;
  string *user_password_local;
  int keylen_local;
  Config *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)__block);
  peVar1->keylen = __edflag;
  if (__edflag == 0x100) {
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(*(__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          **)__block);
    peVar1->use_aes = true;
  }
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)__block);
  std::__cxx11::string::operator=((string *)&peVar1->user_password,in_RCX);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)__block);
  std::__cxx11::string::operator=((string *)&peVar1->owner_password,in_R8);
  this_00 = (EncConfig *)operator_new(8);
  EncConfig::EncConfig(this_00,(Config *)__block);
  std::shared_ptr<QPDFJob::EncConfig>::shared_ptr<QPDFJob::EncConfig,void>
            ((shared_ptr<QPDFJob::EncConfig> *)this,this_00);
  return;
}

Assistant:

std::shared_ptr<QPDFJob::EncConfig>
QPDFJob::Config::encrypt(
    int keylen, std::string const& user_password, std::string const& owner_password)
{
    o.m->keylen = keylen;
    if (keylen == 256) {
        o.m->use_aes = true;
    }
    o.m->user_password = user_password;
    o.m->owner_password = owner_password;
    return std::shared_ptr<EncConfig>(new EncConfig(this));
}